

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O0

int __thiscall soplex::SPxDevexPR<double>::selectLeave(SPxDevexPR<double> *this)

{
  int iVar1;
  Verbosity VVar2;
  SPxBasisBase<double> *this_00;
  SPxOut *in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  double in_stack_00000008;
  SPxDevexPR<double> *in_stack_00000010;
  Verbosity old_verbosity;
  int retid;
  double in_stack_00000040;
  SPxDevexPR<double> *in_stack_00000048;
  char *in_stack_ffffffffffffffd8;
  undefined4 local_14;
  Verbosity local_10;
  int local_c;
  
  if (((*(byte *)((long)in_RDI->m_streams + 0x89b) & 1) == 0) ||
     (((ulong)in_RDI->m_streams[0x113] & 1) == 0)) {
    if (((ulong)in_RDI->m_streams[0x113] & 1) == 0) {
      local_c = selectLeaveX(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
    }
    else {
      local_c = selectLeaveSparse(in_stack_00000010,in_stack_00000008);
    }
  }
  else {
    iVar1 = IdxSet::size((IdxSet *)&in_RDI[4].m_streams);
    if (1 < iVar1) {
      this_00 = SPxSolverBase<double>::basis((SPxSolverBase<double> *)in_RDI->m_streams);
      iVar1 = SPxBasisBase<double>::lastUpdate(this_00);
      if (iVar1 != 0) {
        local_c = selectLeaveHyper(this,_old_verbosity);
        goto LAB_002df5dd;
      }
    }
    local_c = buildBestPriceVectorLeave(in_stack_00000048,in_stack_00000040);
  }
LAB_002df5dd:
  if ((local_c < 0) && ((in_RDI[7].m_verbosity & WARNING) == ERROR)) {
    *(undefined1 *)&in_RDI[7].m_verbosity = WARNING;
    if ((in_RDI->m_streams[0x123] != (ostream *)0x0) &&
       (VVar2 = SPxOut::getVerbosity((SPxOut *)in_RDI->m_streams[0x123]), 4 < (int)VVar2)) {
      local_10 = SPxOut::getVerbosity((SPxOut *)in_RDI->m_streams[0x123]);
      local_14 = 5;
      (**(code **)(*(long *)in_RDI->m_streams[0x123] + 0x10))(in_RDI->m_streams[0x123],&local_14);
      soplex::operator<<(in_RDI,in_stack_ffffffffffffffd8);
      (**(code **)(*(long *)in_RDI->m_streams[0x123] + 0x10))(in_RDI->m_streams[0x123],&local_10);
    }
    local_c = selectLeaveX(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
  }
  return local_c;
}

Assistant:

int SPxDevexPR<R>::selectLeave()
{
   int retid;

   if(this->thesolver->hyperPricingLeave && this->thesolver->sparsePricingLeave)
   {
      if(bestPrices.size() < 2 || this->thesolver->basis().lastUpdate() == 0)
      {
         // call init method to build up price-vector and return index of largest price
         retid = buildBestPriceVectorLeave(this->thetolerance);
      }
      else
         retid = selectLeaveHyper(this->thetolerance);
   }
   else if(this->thesolver->sparsePricingLeave)
      retid = selectLeaveSparse(this->thetolerance);
   else
      retid = selectLeaveX(this->thetolerance);

   if(retid < 0 && !refined)
   {
      refined = true;
      SPX_MSG_INFO3((*this->thesolver->spxout),
                    (*this->thesolver->spxout) << "WDEVEX02 trying refinement step..\n";)
      retid = selectLeaveX(this->thetolerance / SOPLEX_DEVEX_REFINETOL);
   }

   assert(retid < this->thesolver->dim());

   return retid;
}